

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotpsniffer.c
# Opt level: O1

void printbuf(uchar *buffer,int nbytes,int color,int timestamp,int format,timeval *tv,
             timeval *last_tv,canid_t src,int socket,char *candevice,int head)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint __c;
  tm *ptVar3;
  ushort **ppuVar4;
  long lVar5;
  __suseconds_t _Var6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  char *__format;
  tm tm;
  char local_88 [32];
  tm local_68;
  
  if (color == 1) {
    pcVar9 = "\x1b[31m";
LAB_001014a5:
    printf("%s",pcVar9);
  }
  else if (color == 2) {
    pcVar9 = "\x1b[34m";
    goto LAB_001014a5;
  }
  if (timestamp != 0) {
    ioctl(socket,0x8906,tv);
    if (timestamp < 100) {
      if (timestamp == 0x41) {
        ptVar3 = localtime(&tv->tv_sec);
        local_68.tm_sec = ptVar3->tm_sec;
        local_68.tm_min = ptVar3->tm_min;
        local_68.tm_hour = ptVar3->tm_hour;
        local_68.tm_mday = ptVar3->tm_mday;
        local_68.tm_mon = ptVar3->tm_mon;
        local_68.tm_year = ptVar3->tm_year;
        local_68.tm_wday = ptVar3->tm_wday;
        local_68.tm_yday = ptVar3->tm_yday;
        local_68.tm_isdst = ptVar3->tm_isdst;
        local_68._36_4_ = *(undefined4 *)&ptVar3->field_0x24;
        local_68.tm_gmtoff = ptVar3->tm_gmtoff;
        local_68.tm_zone = ptVar3->tm_zone;
        pcVar9 = local_88;
        strftime(pcVar9,0x18,"%Y-%m-%d %H:%M:%S",&local_68);
        _Var6 = tv->tv_usec;
        __format = "(%s.%06llu) ";
      }
      else {
        if (timestamp != 0x61) goto LAB_001015e7;
        pcVar9 = (char *)tv->tv_sec;
        _Var6 = tv->tv_usec;
        __format = "(%llu.%06llu) ";
      }
      printf(__format,pcVar9,_Var6);
    }
    else if ((timestamp == 100) || (timestamp == 0x7a)) {
      if (last_tv->tv_sec == 0) {
        uVar1 = *(undefined4 *)((long)&tv->tv_sec + 4);
        _Var6 = tv->tv_usec;
        uVar2 = *(undefined4 *)((long)&tv->tv_usec + 4);
        *(int *)&last_tv->tv_sec = (int)tv->tv_sec;
        *(undefined4 *)((long)&last_tv->tv_sec + 4) = uVar1;
        *(int *)&last_tv->tv_usec = (int)_Var6;
        *(undefined4 *)((long)&last_tv->tv_usec + 4) = uVar2;
      }
      lVar10 = tv->tv_usec - last_tv->tv_usec;
      lVar5 = lVar10 + 1000000;
      if (-1 < lVar10) {
        lVar5 = lVar10;
      }
      lVar10 = (lVar10 >> 0x3f) + (tv->tv_sec - last_tv->tv_sec);
      if (lVar10 < 0) {
        lVar5 = 0;
      }
      if (lVar10 < 1) {
        lVar10 = 0;
      }
      printf("(%llu.%06llu) ",lVar10,lVar5);
      if (timestamp == 100) {
        _Var6 = tv->tv_usec;
        last_tv->tv_sec = tv->tv_sec;
        last_tv->tv_usec = _Var6;
      }
    }
  }
LAB_001015e7:
  printf(" %s  %03X  [%d]  ",candevice,(ulong)(src & 0x1fffffff),(ulong)(uint)nbytes);
  if ((format & 1U) != 0) {
    uVar7 = 0;
    if (0 < nbytes) {
      uVar7 = (ulong)(uint)nbytes;
    }
    uVar8 = 0;
    do {
      if (uVar7 == uVar8) goto LAB_0010166a;
      printf("%02X ",(ulong)buffer[uVar8]);
      uVar8 = uVar8 + 1;
    } while ((int)uVar8 < head || head == 0);
    printf("... ");
LAB_0010166a:
    if ((format & 2U) != 0) {
      printf(" - ");
    }
  }
  if ((format & 2U) != 0) {
    putchar(0x27);
    uVar7 = 0;
    uVar8 = (ulong)(uint)nbytes;
    if (nbytes < 1) {
      uVar8 = 0;
    }
    do {
      if (uVar8 == uVar7) goto LAB_001016e4;
      ppuVar4 = __ctype_b_loc();
      __c = 0x2e;
      if (((*ppuVar4)[buffer[uVar7]] >> 0xe & 1) != 0) {
        __c = (uint)buffer[uVar7];
      }
      putchar(__c);
      uVar7 = uVar7 + 1;
    } while (head == 0 || (int)uVar7 < head);
    uVar8 = (ulong)((int)uVar7 - 1);
LAB_001016e4:
    putchar(0x27);
    if ((head != 0) && (head <= (int)uVar8 + 1)) {
      printf(" ... ");
    }
  }
  if (color != 0) {
    printf("%s","\x1b[0m");
  }
  putchar(10);
  fflush(_stdout);
  return;
}

Assistant:

void printbuf(unsigned char *buffer, int nbytes, int color, int timestamp,
	      int format, struct timeval *tv, struct timeval *last_tv,
	      canid_t src, int socket, char *candevice, int head)
{
	int i;

	if (color == 1)
		printf("%s", FGRED);

	if (color == 2)
		printf("%s", FGBLUE);

	if (timestamp) {
		ioctl(socket, SIOCGSTAMP, tv);

		switch (timestamp) {

		case 'a': /* absolute with timestamp */
			printf("(%llu.%06llu) ", (unsigned long long)tv->tv_sec, (unsigned long long)tv->tv_usec);
			break;

		case 'A': /* absolute with date */
		{
			struct tm tm;
			char timestring[25];

			tm = *localtime(&tv->tv_sec);
			strftime(timestring, 24, "%Y-%m-%d %H:%M:%S", &tm);
			printf("(%s.%06llu) ", timestring, (unsigned long long)tv->tv_usec);
		}
		break;

		case 'd': /* delta */
		case 'z': /* starting with zero */
		{
			struct timeval diff;

			if (last_tv->tv_sec == 0)   /* first init */
				*last_tv = *tv;
			diff.tv_sec  = tv->tv_sec  - last_tv->tv_sec;
			diff.tv_usec = tv->tv_usec - last_tv->tv_usec;
			if (diff.tv_usec < 0)
				diff.tv_sec--, diff.tv_usec += 1000000;
			if (diff.tv_sec < 0)
				diff.tv_sec = diff.tv_usec = 0;
			printf("(%llu.%06llu) ", (unsigned long long)diff.tv_sec, (unsigned long long)diff.tv_usec);

			if (timestamp == 'd')
				*last_tv = *tv; /* update for delta calculation */
		}
		break;

		default: /* no timestamp output */
			break;
		}
	}

	/* the source socket gets pdu data from the destination id */
	printf(" %s  %03X  [%d]  ", candevice, src & CAN_EFF_MASK, nbytes);
	if (format & FORMAT_HEX) {
		for (i=0; i<nbytes; i++) {
			printf("%02X ", buffer[i]);
			if (head && i+1 >= head) {
				printf("... ");
				break;
			}
		}
		if (format & FORMAT_ASCII)
			printf(" - ");
	}
	if (format & FORMAT_ASCII) {
		printf("'");
		for (i=0; i<nbytes; i++) {
			if (isprint(buffer[i]))
				printf("%c", buffer[i]);
			else
				printf(".");
			if (head && i+1 >= head)
				break;
		}
		printf("'");
		if (head && i+1 >= head)
			printf(" ... ");
	}

	if (color)
		printf("%s", ATTRESET);

	printf("\n");
	fflush(stdout);
}